

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

expression_ptr __thiscall mjs::parser::parse_expression(parser *this)

{
  expression_ptr *in_RSI;
  position_stack_node _expression_position__LINE__;
  undefined1 local_40 [16];
  expression *local_30;
  expression_ptr *local_28;
  undefined4 local_20;
  
  local_28 = in_RSI + 0xd;
  local_30 = in_RSI[0xd]._M_t.
             super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
             super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
             super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
  in_RSI[0xd]._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
  _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
  super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl = (expression *)(local_40 + 8);
  local_20 = *(undefined4 *)
              ((long)&in_RSI[0xc]._M_t.
                      super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                      .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl + 4);
  parse_assignment_expression((parser *)local_40);
  parse_expression1(this,in_RSI,(int)local_40);
  if ((element_type *)local_40._0_8_ != (element_type *)0x0) {
    (**(code **)(*(long *)local_40._0_8_ + 8))();
  }
  if ((local_28->_M_t).super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
      ._M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
      super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl == (expression *)(local_40 + 8))
  {
    (local_28->_M_t).super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
    _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
    super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl = local_30;
    return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
           (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)this;
  }
  __assert_fail("stack_ == this",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp",
                0x116,"mjs::parser::position_stack_node::~position_stack_node()");
}

Assistant:

expression_ptr parse_expression() {
        RECORD_EXPRESSION_START;
        return parse_expression1(parse_assignment_expression(), comma_precedence);
    }